

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitvector.hpp
# Opt level: O2

size_t __thiscall
bv::internal::bt_impl<4096UL,_(bv::allocation_policy_t)0>::alloc_leaf
          (bt_impl<4096UL,_(bv::allocation_policy_t)0> *this)

{
  size_type __new_size;
  size_t sVar1;
  
  sVar1 = this->free_leaf;
  __new_size = sVar1 + 1;
  this->free_leaf = __new_size;
  std::
  deque<bv::internal::bitview<bv::internal::bitarray_t<4096UL>::array>,_std::allocator<bv::internal::bitview<bv::internal::bitarray_t<4096UL>::array>_>_>
  ::resize(&this->leaves,__new_size);
  return sVar1;
}

Assistant:

size_t bt_impl<W, AP>::alloc_leaf() {
            assert(used_leaves() < leaves_count &&
                   "Maximum number of leaves exceeded");
            
            size_t leaf = free_leaf++;
            
            if(AP == alloc_on_demand)
                leaves.resize(used_leaves());
            
            return leaf;
        }